

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_util.cc
# Opt level: O3

bool RetryAsync(SSL *ssl,int ret)

{
  uint uVar1;
  MockQuicTransport *this;
  pointer __p;
  bool bVar2;
  int iVar3;
  TestConfig *pTVar4;
  TestState *pTVar5;
  timeval *ptVar6;
  long lVar7;
  long lVar8;
  
  pTVar4 = GetTestConfig(ssl);
  pTVar5 = GetTestState(ssl);
  if (ret < 0) {
    iVar3 = SSL_get_error((SSL *)ssl,ret);
    if (iVar3 == 0x13) {
      if (pTVar4->renegotiate_explicit == true) {
        pTVar5->explicit_renegotiates = pTVar5->explicit_renegotiates + 1;
        iVar3 = SSL_renegotiate((SSL *)ssl);
        return iVar3 != 0;
      }
    }
    else {
      this = (pTVar5->quic_transport)._M_t.
             super___uniq_ptr_impl<MockQuicTransport,_std::default_delete<MockQuicTransport>_>._M_t.
             super__Tuple_impl<0UL,_MockQuicTransport_*,_std::default_delete<MockQuicTransport>_>.
             super__Head_base<0UL,_MockQuicTransport_*,_false>._M_head_impl;
      if (iVar3 == 2 && this != (MockQuicTransport *)0x0) {
        bVar2 = MockQuicTransport::ReadHandshake(this);
        return bVar2;
      }
    }
    if (pTVar4->async == true) {
      if ((pTVar5->packeted_bio != (BIO *)0x0) &&
         (bVar2 = PacketedBioAdvanceClock(pTVar5->packeted_bio), bVar2)) {
        iVar3 = DTLSv1_handle_timeout(ssl);
        if (-1 < iVar3) {
          return true;
        }
        iVar3 = SSL_get_error((SSL *)ssl,iVar3);
      }
      switch(iVar3) {
      case 2:
        AsyncBioAllowRead(pTVar5->async_bio,1);
        break;
      case 3:
        AsyncBioAllowWrite(pTVar5->async_bio,1);
        break;
      case 4:
        pTVar5->cert_ready = true;
        break;
      default:
        return false;
      case 0xb:
        __p = (pTVar5->pending_session)._M_t.
              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        (pTVar5->pending_session)._M_t.
        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl = (ssl_session_st *)0x0;
        std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)&pTVar5->session,__p)
        ;
        break;
      case 0xc:
        pTVar5->early_callback_ready = true;
        break;
      case 0xd:
        uVar1 = pTVar5->private_key_retries;
        pTVar5->private_key_retries = uVar1 + 1;
        if (uVar1 != 0 || pTVar4->private_key_delay_ms == 0) {
          return true;
        }
        if (pTVar5->packeted_bio != (BIO *)0x0) {
          ptVar6 = PacketedBioGetClock(pTVar5->packeted_bio);
          iVar3 = pTVar4->private_key_delay_ms;
          lVar7 = (long)(iVar3 / 1000) + ptVar6->tv_sec;
          ptVar6->tv_sec = lVar7;
          lVar8 = (long)iVar3 * 1000 + ptVar6->tv_usec;
          ptVar6->tv_usec = lVar8;
          if (999999 < lVar8) {
            ptVar6->tv_usec = lVar8 + -1000000;
            ptVar6->tv_sec = lVar7 + 1;
          }
          iVar3 = DTLSv1_handle_timeout(ssl);
          if (iVar3 < 0) {
            iVar3 = SSL_get_error((SSL *)ssl,iVar3);
            if (iVar3 != 3) {
              return false;
            }
            AsyncBioAllowWrite(pTVar5->async_bio,1);
            return true;
          }
          return true;
        }
        RetryAsync();
        return false;
      case 0xe:
        pTVar5->async_ticket_decrypt_ready = true;
        break;
      case 0x10:
        pTVar5->custom_verify_ready = true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool RetryAsync(SSL *ssl, int ret) {
  const TestConfig *config = GetTestConfig(ssl);
  TestState *test_state = GetTestState(ssl);
  if (ret >= 0) {
    return false;
  }

  int ssl_err = SSL_get_error(ssl, ret);
  if (ssl_err == SSL_ERROR_WANT_RENEGOTIATE && config->renegotiate_explicit) {
    test_state->explicit_renegotiates++;
    return SSL_renegotiate(ssl);
  }

  if (test_state->quic_transport && ssl_err == SSL_ERROR_WANT_READ) {
    return test_state->quic_transport->ReadHandshake();
  }

  if (!config->async) {
    // Only asynchronous tests should trigger other retries.
    return false;
  }

  if (test_state->packeted_bio != nullptr &&
      PacketedBioAdvanceClock(test_state->packeted_bio)) {
    int timeout_ret = DTLSv1_handle_timeout(ssl);
    if (timeout_ret >= 0) {
      return true;
    }
    ssl_err = SSL_get_error(ssl, timeout_ret);
  }

  // See if we needed to read or write more. If so, allow one byte through on
  // the appropriate end to maximally stress the state machine.
  switch (ssl_err) {
    case SSL_ERROR_WANT_READ:
      AsyncBioAllowRead(test_state->async_bio, 1);
      return true;
    case SSL_ERROR_WANT_WRITE:
      AsyncBioAllowWrite(test_state->async_bio, 1);
      return true;
    case SSL_ERROR_WANT_X509_LOOKUP:
      test_state->cert_ready = true;
      return true;
    case SSL_ERROR_PENDING_SESSION:
      test_state->session = std::move(test_state->pending_session);
      return true;
    case SSL_ERROR_PENDING_CERTIFICATE:
      test_state->early_callback_ready = true;
      return true;
    case SSL_ERROR_WANT_PRIVATE_KEY_OPERATION:
      test_state->private_key_retries++;
      if (config->private_key_delay_ms != 0 &&
          test_state->private_key_retries == 1) {
        // The first time around, simulate the private key operation taking a
        // long time to run.
        if (test_state->packeted_bio == nullptr) {
          fprintf(stderr, "-private-key-delay-ms requires DTLS.\n");
          return false;
        }
        timeval *clock = PacketedBioGetClock(test_state->packeted_bio);
        clock->tv_sec += config->private_key_delay_ms / 1000;
        clock->tv_usec += config->private_key_delay_ms * 1000;
        if (clock->tv_usec >= 1000000) {
          clock->tv_usec -= 1000000;
          clock->tv_sec++;
        }
        int timeout_ret = DTLSv1_handle_timeout(ssl);
        if (timeout_ret < 0) {
          if (SSL_get_error(ssl, timeout_ret) == SSL_ERROR_WANT_WRITE) {
            AsyncBioAllowWrite(test_state->async_bio, 1);
            return true;
          }
          return false;
        }
      }
      return true;
    case SSL_ERROR_WANT_CERTIFICATE_VERIFY:
      test_state->custom_verify_ready = true;
      return true;
    case SSL_ERROR_PENDING_TICKET:
      test_state->async_ticket_decrypt_ready = true;
      return true;
    default:
      return false;
  }
}